

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

int loguru::init(EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  Text TVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  size_t __n;
  locale *in_RDX;
  undefined8 *puVar8;
  uint uVar9;
  undefined8 *in_RSI;
  char *format;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  double __x;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x_00;
  Text fail_info;
  Text str_right;
  uint local_fc;
  int val_right;
  int val_left;
  undefined8 *local_f0;
  long local_e8;
  EVP_PKEY_CTX *local_e0;
  Text user_msg;
  Text str_left;
  sigset_t local_c0;
  byte local_40;
  
  val_left = *(int *)ctx;
  val_right = 0;
  local_e0 = ctx;
  if ((long)val_left < 1) {
    format_value<int>((loguru *)&str_left,&val_left);
    format_value<int>((loguru *)&str_right,&val_right);
    textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","argc",">","0",
               str_left._str,">");
    textprintf((char *)&user_msg,"Expected proper argc/argv");
    log_and_abort(0,fail_info._str,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                  ,0x215,"%s",user_msg._str);
  }
  if (in_RSI[val_left] != 0) {
    textprintf((char *)&str_left,"N/A");
    textprintf((char *)&str_right,"N/A");
    textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","argv[argc]","==",
               "nullptr",str_left._str,"==");
    textprintf((char *)&user_msg,"Expected proper argc/argv");
    log_and_abort(0,fail_info._str,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                  ,0x216,"%s",user_msg._str);
  }
  filename((char *)*in_RSI);
  std::__cxx11::string::assign((char *)&s_argv0_filename_abi_cxx11_);
  pcVar6 = getcwd(&s_current_dir,0x1000);
  local_f0 = in_RSI;
  if (pcVar6 == (char *)0x0) {
    errno_as_text();
    TVar2 = str_left;
    iVar12 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar12 = g_stderr_verbosity;
    }
    if (-2 < iVar12) {
      log(__x);
    }
    free(TVar2._str);
  }
  puVar8 = local_f0;
  pcVar6 = "";
  std::__cxx11::string::assign((char *)&s_arguments_abi_cxx11_);
  lVar14 = 0;
  while( true ) {
    local_fc = *(uint *)local_e0;
    uVar7 = (ulong)(int)local_fc;
    if ((long)uVar7 <= lVar14) break;
    pcVar6 = (char *)puVar8[lVar14];
    local_e8 = lVar14;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str_left,pcVar6,(allocator<char> *)&str_right);
    uVar7 = local_c0.__val[0];
    TVar2 = str_left;
    for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      bVar1 = TVar2._str[uVar10];
      pcVar6 = "\\a";
      switch(bVar1) {
      case 7:
        break;
      case 8:
        pcVar6 = "\\b";
        break;
      case 9:
        pcVar6 = "\\t";
        break;
      case 10:
        pcVar6 = "\\n";
        break;
      case 0xb:
        pcVar6 = "\\v";
        break;
      case 0xc:
        pcVar6 = "\\f";
        break;
      case 0xd:
        pcVar6 = "\\r";
        break;
      default:
        if (bVar1 == 0x20) {
          pcVar6 = "\\ ";
          break;
        }
        if (bVar1 == 0x22) {
          pcVar6 = "\\\"";
          break;
        }
        uVar9 = (uint)bVar1;
        if (uVar9 == 0x27) {
          pcVar6 = "\\\'";
          break;
        }
        if (uVar9 == 0x5c) {
          pcVar6 = "\\\\";
          break;
        }
        if (bVar1 < 0x20) {
          pcVar6 = "\\x";
          std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
          write_hex_digit((string *)(ulong)(bVar1 >> 4),(uint)pcVar6);
          write_hex_digit((string *)(ulong)(uVar9 & 0xf),(uint)pcVar6);
        }
        else {
          pcVar6 = (char *)(ulong)(uint)(int)(char)bVar1;
          std::__cxx11::string::push_back(-0x38);
        }
        goto LAB_00124c48;
      }
      std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
LAB_00124c48:
    }
    std::__cxx11::string::~string((string *)&str_left);
    puVar8 = local_f0;
    lVar14 = local_e8 + 1;
    if ((int)lVar14 < (int)*(uint *)local_e0) {
      pcVar6 = " ";
      std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
    }
  }
  if (in_RDX != (locale *)0x0) {
    iVar13 = 1;
    for (iVar12 = 1; iVar12 < (int)uVar7; iVar12 = iVar12 + 1) {
      pcVar11 = (char *)puVar8[iVar12];
      __n = strlen((char *)in_RDX);
      pcVar6 = (char *)in_RDX;
      iVar5 = strncmp(pcVar11,(char *)in_RDX,__n);
      if (iVar5 == 0) {
        local_e8 = CONCAT44(local_e8._4_4_,iVar12);
        cVar4 = pcVar11[__n];
        std::locale::locale((locale *)&str_left,"");
        pcVar6 = (char *)&str_left;
        bVar3 = std::isalpha<char>(cVar4,(locale *)&str_left);
        std::locale::~locale((locale *)&str_left);
        puVar8 = local_f0;
        if (bVar3) {
          pcVar11 = (char *)local_f0[iVar12];
          iVar12 = (int)local_e8;
          goto LAB_00124d60;
        }
        pcVar11 = pcVar11 + __n;
        cVar4 = *pcVar11;
        if (cVar4 == '\0') {
          iVar12 = (int)local_e8 + 1;
          val_right = *(int *)local_e0;
          val_left = iVar12;
          if (val_right <= iVar12) {
            format_value<int>((loguru *)&str_left,&val_left);
            format_value<int>((loguru *)&str_right,&val_right);
            textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","arg_it","<",
                       "argc",str_left._str,"<");
            textprintf((char *)&user_msg,"Missing verbosiy level after %s",in_RDX,str_right._str);
            log_and_abort(0,fail_info._str,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                          ,0x1ab,"%s",user_msg._str);
          }
          pcVar11 = (char *)local_f0[iVar12];
          local_fc = local_fc - 2;
          cVar4 = *pcVar11;
        }
        else {
          local_fc = local_fc - 1;
          iVar12 = (int)local_e8;
        }
        pcVar11 = pcVar11 + (cVar4 == '=');
        iVar5 = get_verbosity_from_name(pcVar11);
        if (iVar5 == -10) {
          str_left._str = (char *)0x0;
          pcVar6 = (char *)&str_left;
          lVar14 = strtol(pcVar11,(char **)pcVar6,10);
          g_stderr_verbosity = (int)lVar14;
          if ((str_left._str == (char *)0x0) || (iVar5 = g_stderr_verbosity, *str_left._str != '\0')
             ) {
            pcVar6 = "CHECK FAILED:  end && *end == \'\\0\'  ";
            format = "Invalid verbosity. Expected integer, INFO, WARNING, ERROR or OFF, got \'%s\'";
            uVar9 = 0x1b8;
            goto LAB_00124fde;
          }
        }
      }
      else {
LAB_00124d60:
        lVar14 = (long)iVar13;
        iVar13 = iVar13 + 1;
        local_f0[lVar14] = pcVar11;
        puVar8 = local_f0;
        iVar5 = g_stderr_verbosity;
      }
      g_stderr_verbosity = iVar5;
      uVar7 = (ulong)*(uint *)local_e0;
    }
    *(uint *)local_e0 = local_fc;
    puVar8[(int)local_fc] = 0;
  }
  set_thread_name("main thread");
  __x_00 = extraout_XMM0_Qa;
  if (-1 < g_stderr_verbosity) {
    if (g_preamble == '\x01') {
      print_preamble_header((char *)&str_left,(size_t)pcVar6);
      if ((g_colorlogtostderr == '\x01') && (s_terminal_has_color == '\x01')) {
        fprintf(_stderr,"%s%s%s\n","\x1b[0m","\x1b[2m",&str_left);
      }
      else {
        fprintf(_stderr,"%s\n",&str_left);
      }
    }
    fflush(_stderr);
    __x_00 = extraout_XMM0_Qa_00;
  }
  iVar12 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar12 = g_stderr_verbosity;
  }
  if (g_internal_verbosity <= iVar12) {
    __x_00 = log(__x_00);
  }
  iVar12 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar12 = g_stderr_verbosity;
  }
  if ((s_current_dir != '\0') && (g_internal_verbosity <= iVar12)) {
    __x_00 = log(__x_00);
  }
  iVar12 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar12 = g_stderr_verbosity;
  }
  if ((g_internal_verbosity <= iVar12) &&
     (__x_00 = log(__x_00), iVar12 = s_max_out_verbosity, s_max_out_verbosity < g_stderr_verbosity))
  {
    iVar12 = g_stderr_verbosity;
  }
  if (g_internal_verbosity <= iVar12) {
    log(__x_00);
  }
  memset((sigaction *)&str_left,0,0x98);
  sigemptyset(&local_c0);
  local_40 = local_40 | 4;
  str_left._str = (char *)signal_handler;
  lVar14 = 0;
  do {
    lVar15 = lVar14;
    if (lVar15 == 0x70) {
      iVar12 = atexit(on_atexit);
      return iVar12;
    }
    iVar12 = sigaction(*(int *)((long)&ALL_SIGNALS + lVar15),(sigaction *)&str_left,(sigaction *)0x0
                      );
    lVar14 = lVar15 + 0x10;
  } while (iVar12 != -1);
  pcVar11 = *(char **)((long)&PTR_anon_var_dwarf_d3382_0015ca28 + lVar15);
  pcVar6 = "CHECK FAILED:  sigaction(s.number, &sig_action, NULL) != -1  ";
  format = "Failed to install handler for %s";
  uVar9 = 0x6fb;
LAB_00124fde:
  log_and_abort(0,pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                ,uVar9,format,pcVar11);
}

Assistant:

void init(int& argc, char* argv[], const char* verbosity_flag)
	{
		CHECK_GT_F(argc,       0,       "Expected proper argc/argv");
		CHECK_EQ_F(argv[argc], nullptr, "Expected proper argc/argv");

		s_argv0_filename = filename(argv[0]);

		#ifdef _WIN32
			#define getcwd _getcwd
		#endif

		if (!getcwd(s_current_dir, sizeof(s_current_dir)))
		{
			const auto error_text = errno_as_text();
			LOG_F(WARNING, "Failed to get current working directory: %s", error_text.c_str());
		}

		s_arguments = "";
		for (int i = 0; i < argc; ++i) {
			escape(s_arguments, argv[i]);
			if (i + 1 < argc) {
				s_arguments += " ";
			}
		}

		if (verbosity_flag) {
			parse_args(argc, argv, verbosity_flag);
		}

		#if LOGURU_PTLS_NAMES || LOGURU_WINTHREADS
			set_thread_name("main thread");
		#elif LOGURU_PTHREADS
			char old_thread_name[16] = {0};
			auto this_thread = pthread_self();
			#if defined(__APPLE__) || defined(__linux__)
				pthread_getname_np(this_thread, old_thread_name, sizeof(old_thread_name));
			#endif
			if (old_thread_name[0] == 0) {
				#ifdef __APPLE__
					pthread_setname_np("main thread");
				#elif defined(__FreeBSD__) || defined(__OpenBSD__)
					pthread_set_name_np(this_thread, "main thread");
				#elif defined(__linux__)
					pthread_setname_np(this_thread, "main thread");
				#endif
			}
		#endif // LOGURU_PTHREADS

		if (g_stderr_verbosity >= Verbosity_INFO) {
			if (g_preamble) {
				char preamble_explain[LOGURU_PREAMBLE_WIDTH];
				print_preamble_header(preamble_explain, sizeof(preamble_explain));
				if (g_colorlogtostderr && s_terminal_has_color) {
					fprintf(stderr, "%s%s%s\n", terminal_reset(), terminal_dim(), preamble_explain);
				} else {
					fprintf(stderr, "%s\n", preamble_explain);
				}
			}
			fflush(stderr);
		}
		VLOG_F(g_internal_verbosity, "arguments: %s", s_arguments.c_str());
		if (strlen(s_current_dir) != 0)
		{
			VLOG_F(g_internal_verbosity, "Current dir: %s", s_current_dir);
		}
		VLOG_F(g_internal_verbosity, "stderr verbosity: %d", g_stderr_verbosity);
		VLOG_F(g_internal_verbosity, "-----------------------------------");

		install_signal_handlers();

		atexit(on_atexit);
	}